

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_diff.cpp
# Opt level: O3

void __thiscall Diff_BuildWriteIndexValues_Test::TestBody(Diff_BuildWriteIndexValues_Test *this)

{
  database *pdVar1;
  undefined1 *puVar2;
  uint uVar3;
  hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *matchers_1;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>
  *matchers;
  pointer *__ptr;
  __normal_iterator<pstore::address_*,_std::vector<pstore::address,_std::allocator<pstore::address>_>_>
  _Var4;
  char *pcVar5;
  __normal_iterator<pstore::address_*,_std::vector<pstore::address,_std::allocator<pstore::address>_>_>
  in_R9;
  extent<char> eVar6;
  string k1;
  vector<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>_>_>
  actual_values;
  shared_ptr<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  index;
  transaction_type t1;
  value_type v2;
  value_type v1;
  string local_258;
  string local_238;
  char local_218 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_210;
  shared_ptr<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_208;
  undefined1 local_1f8 [8];
  database *pdStack_1f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1e8;
  undefined4 local_1d8;
  undefined4 uStack_1d4;
  undefined4 uStack_1d0;
  undefined4 uStack_1cc;
  _Alloc_hider local_1c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b8 [2];
  undefined1 local_190 [8];
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_188 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_180;
  extent<char> local_170;
  _Alloc_hider local_160;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_150 [2];
  mutex_type *local_130;
  database *local_128;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>
  local_120;
  undefined1 *local_f0;
  undefined8 local_e8;
  undefined1 local_e0;
  undefined7 uStack_df;
  address local_d0;
  uint64_t uStack_c8;
  UnorderedElementsAreMatcher<std::tuple<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>_>_>
  local_c0;
  _Tuple_impl<0UL,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>_>
  local_90;
  
  local_f0 = &local_e0;
  local_e8 = 0;
  local_e0 = 0;
  local_d0.a_ = 0;
  uStack_c8 = 0;
  local_120.first._M_dataplus._M_p = (pointer)&local_120.first.field_2;
  local_120.first._M_string_length = 0;
  local_120.first.field_2._M_local_buf[0] = '\0';
  local_120.second.addr.a_.a_ = (address)0;
  local_120.second.size = 0;
  local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_258,"key1","");
  puVar2 = &(this->super_Diff).field_0x150;
  local_188[0] = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  )0x0;
  local_190 = (undefined1  [8])puVar2;
  std::unique_lock<mock_mutex>::lock((unique_lock<mock_mutex> *)local_190);
  pdVar1 = &(this->super_Diff).db_;
  local_188[0] = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  )0x1;
  pstore::transaction<std::unique_lock<mock_mutex>_>::transaction
            ((transaction<std::unique_lock<mock_mutex>_> *)local_1f8,pdVar1,(lock_type *)local_190);
  local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
  local_130 = (mutex_type *)puVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,"first value","");
  local_128 = pdVar1;
  eVar6 = anon_unknown.dwarf_1214cb::Diff::add
                    (&this->super_Diff,(transaction_type *)local_1f8,&local_258,&local_238);
  local_190 = (undefined1  [8])&local_180;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_190,local_258._M_dataplus._M_p,
             local_258._M_dataplus._M_p + (long)(index_base *)local_258._M_string_length);
  local_170 = eVar6;
  std::__cxx11::string::operator=((string *)&local_f0,(string *)local_190);
  local_d0 = local_170.addr.a_.a_;
  uStack_c8 = local_170.size;
  if (local_190 != (undefined1  [8])&local_180) {
    operator_delete((void *)local_190,local_180._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != &local_238.field_2) {
    operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
  }
  pstore::transaction_base::commit((transaction_base *)local_1f8);
  pdVar1 = local_128;
  local_1f8 = (undefined1  [8])&PTR__transaction_0026b340;
  pstore::transaction_base::rollback((transaction_base *)local_1f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258._M_dataplus._M_p != &local_258.field_2) {
    operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
  }
  local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_258,"key2","");
  local_190 = (undefined1  [8])local_130;
  local_188[0] = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  )0x0;
  std::unique_lock<mock_mutex>::lock((unique_lock<mock_mutex> *)local_190);
  local_188[0] = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  )0x1;
  pstore::transaction<std::unique_lock<mock_mutex>_>::transaction
            ((transaction<std::unique_lock<mock_mutex>_> *)local_1f8,pdVar1,(lock_type *)local_190);
  local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,"second value","");
  eVar6 = anon_unknown.dwarf_1214cb::Diff::add
                    (&this->super_Diff,(transaction_type *)local_1f8,&local_258,&local_238);
  local_190 = (undefined1  [8])&local_180;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_190,local_258._M_dataplus._M_p,
             local_258._M_dataplus._M_p + (long)(index_base *)local_258._M_string_length);
  local_170 = eVar6;
  std::__cxx11::string::operator=((string *)&local_120,(string *)local_190);
  local_120.second.addr.a_.a_ = local_170.addr.a_.a_;
  local_120.second.size = local_170.size;
  if (local_190 != (undefined1  [8])&local_180) {
    operator_delete((void *)local_190,local_180._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != &local_238.field_2) {
    operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
  }
  pstore::transaction_base::commit((transaction_base *)local_1f8);
  local_1f8 = (undefined1  [8])&PTR__transaction_0026b340;
  pstore::transaction_base::rollback((transaction_base *)local_1f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258._M_dataplus._M_p != &local_258.field_2) {
    operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
  }
  local_190._0_4_ = 2;
  uVar3 = pstore::database::get_current_revision(pdVar1);
  local_258._M_dataplus._M_p._0_4_ = uVar3;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)local_1f8,"2U","db_.get_current_revision ()",(uint *)local_190,
             (uint *)&local_258);
  if (local_1f8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_190);
    if (pdStack_1f0 == (database *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((_Alloc_hider *)&pdStack_1f0->_vptr_database)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_258,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_diff.cpp"
               ,0x6d,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_258,(Message *)local_190);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_258);
    if (local_190 != (undefined1  [8])0x0) {
      (**(code **)(*(size_type *)local_190 + 8))();
    }
    if (pdStack_1f0 != (database *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&pdStack_1f0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pdStack_1f0)
      ;
    }
  }
  else {
    if (pdStack_1f0 != (database *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&pdStack_1f0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pdStack_1f0)
      ;
    }
    pstore::index::
    get_index<(pstore::trailer::indices)5,pstore::database,pstore::index::hamt_map<std::__cxx11::string,pstore::extent<char>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>>>
              ((index *)&local_208,pdVar1,true);
    _Var4._M_current = (address *)local_190;
    local_190 = (undefined1  [8])0x0;
    testing::internal::
    CmpHelperNE<std::shared_ptr<pstore::index::hamt_map<std::__cxx11::string,pstore::extent<char>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>>>,decltype(nullptr)>
              ((internal *)local_1f8,"index","nullptr",&local_208,(void **)_Var4._M_current);
    if (local_1f8[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_190);
      if (pdStack_1f0 == (database *)0x0) {
        pcVar5 = "";
      }
      else {
        pcVar5 = ((_Alloc_hider *)&pdStack_1f0->_vptr_database)->_M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_258,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_diff.cpp"
                 ,0x72,pcVar5);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_258,(Message *)local_190);
    }
    else {
      if (pdStack_1f0 != (database *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&pdStack_1f0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     pdStack_1f0);
      }
      local_258._M_dataplus._M_p = (pointer)0x0;
      local_258._M_string_length = 0;
      local_258.field_2._M_allocated_capacity = 0;
      pstore::
      diff<pstore::index::hamt_map<std::__cxx11::string,pstore::extent<char>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>>,std::back_insert_iterator<std::vector<pstore::address,std::allocator<pstore::address>>>>
                (pdVar1,local_208.
                        super___shared_ptr<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr,0,
                 (vector<pstore::address,_std::allocator<pstore::address>_> *)&local_258);
      matchers_1 = (hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_258._M_string_length;
      (anonymous_namespace)::
      addresses_to_values<pstore::index::hamt_map<std::__cxx11::string,pstore::extent<char>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>>,__gnu_cxx::__normal_iterator<pstore::address*,std::vector<pstore::address,std::allocator<pstore::address>>>>
                ((vector<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>_>_>
                  *)&local_238,(_anonymous_namespace_ *)pdVar1,
                 (database *)local_258._M_dataplus._M_p,
                 (hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_258._M_string_length,_Var4,in_R9);
      testing::
      UnorderedElementsAre<std::pair<std::__cxx11::string,pstore::extent<char>>,std::pair<std::__cxx11::string,pstore::extent<char>>>
                ((UnorderedElementsAreMatcher<std::tuple<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>_>_>
                  *)&local_90,(testing *)&local_f0,&local_120,
                 (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>
                  *)matchers_1);
      std::
      _Tuple_impl<0UL,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>_>
      ::_Tuple_impl((_Tuple_impl<0UL,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>_>
                     *)local_1f8,&local_90);
      std::
      _Tuple_impl<0UL,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>_>
      ::_Tuple_impl((_Tuple_impl<0UL,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>_>
                     *)local_190,
                    (_Tuple_impl<0UL,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>_>
                     *)local_1f8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c8._M_p != local_1b8) {
        operator_delete(local_1c8._M_p,local_1b8[0]._M_allocated_capacity + 1);
      }
      if (local_1f8 != (undefined1  [8])&local_1e8) {
        operator_delete((void *)local_1f8,local_1e8._M_allocated_capacity + 1);
      }
      testing::internal::
      PredicateFormatterFromMatcher<testing::internal::UnorderedElementsAreMatcher<std::tuple<std::pair<std::__cxx11::string,pstore::extent<char>>,std::pair<std::__cxx11::string,pstore::extent<char>>>>>
      ::operator()(local_218,local_190,
                   (vector<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>_>_>
                    *)"actual_values");
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_160._M_p != local_150) {
        operator_delete(local_160._M_p,local_150[0]._M_allocated_capacity + 1);
      }
      if (local_190 != (undefined1  [8])&local_180) {
        operator_delete((void *)local_190,local_180._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90.
             super__Head_base<0UL,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>,_false>
             ._M_head_impl.first._M_dataplus._M_p !=
          &local_90.
           super__Head_base<0UL,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>,_false>
           ._M_head_impl.first.field_2) {
        operator_delete(local_90.
                        super__Head_base<0UL,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>,_false>
                        ._M_head_impl.first._M_dataplus._M_p,
                        local_90.
                        super__Head_base<0UL,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>,_false>
                        ._M_head_impl.first.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90.
             super__Tuple_impl<1UL,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>_>
             .
             super__Head_base<1UL,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>,_false>
             ._M_head_impl.first._M_dataplus._M_p !=
          &local_90.
           super__Tuple_impl<1UL,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>_>
           .
           super__Head_base<1UL,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>,_false>
           ._M_head_impl.first.field_2) {
        operator_delete(local_90.
                        super__Tuple_impl<1UL,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>_>
                        .
                        super__Head_base<1UL,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>,_false>
                        ._M_head_impl.first._M_dataplus._M_p,
                        local_90.
                        super__Tuple_impl<1UL,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>_>
                        .
                        super__Head_base<1UL,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>,_false>
                        ._M_head_impl.first.field_2._M_allocated_capacity + 1);
      }
      if (local_218[0] == '\0') {
        testing::Message::Message((Message *)local_1f8);
        if (local_210 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar5 = "";
        }
        else {
          pcVar5 = (local_210->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)local_190,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_diff.cpp"
                   ,0x78,pcVar5);
        testing::internal::AssertHelper::operator=((AssertHelper *)local_190,(Message *)local_1f8);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_190);
        if (local_1f8 != (undefined1  [8])0x0) {
          (**(code **)(*(size_type *)local_1f8 + 8))();
        }
      }
      if (local_210 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_210,local_210);
      }
      std::
      vector<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>_>_>
      ::~vector((vector<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>_>_>
                 *)&local_238);
      if ((database *)local_258._M_dataplus._M_p != (database *)0x0) {
        operator_delete(local_258._M_dataplus._M_p,
                        local_258.field_2._M_allocated_capacity - (long)local_258._M_dataplus._M_p);
      }
      if (local_208.
          super___shared_ptr<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_208.
                   super___shared_ptr<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      pstore::index::
      get_index<(pstore::trailer::indices)5,pstore::database,pstore::index::hamt_map<std::__cxx11::string,pstore::extent<char>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>>>
                ((index *)&local_208,pdVar1,true);
      _Var4._M_current = (address *)local_190;
      local_190 = (undefined1  [8])0x0;
      testing::internal::
      CmpHelperNE<std::shared_ptr<pstore::index::hamt_map<std::__cxx11::string,pstore::extent<char>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>>>,decltype(nullptr)>
                ((internal *)local_1f8,"index","nullptr",&local_208,(void **)_Var4._M_current);
      if (local_1f8[0] != (internal)0x0) {
        if (pdStack_1f0 != (database *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&pdStack_1f0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       pdStack_1f0);
        }
        local_258._M_dataplus._M_p = (pointer)0x0;
        local_258._M_string_length = 0;
        local_258.field_2._M_allocated_capacity = 0;
        pstore::
        diff<pstore::index::hamt_map<std::__cxx11::string,pstore::extent<char>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>>,std::back_insert_iterator<std::vector<pstore::address,std::allocator<pstore::address>>>>
                  (pdVar1,local_208.
                          super___shared_ptr<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr,1,
                   (vector<pstore::address,_std::allocator<pstore::address>_> *)&local_258);
        (anonymous_namespace)::
        addresses_to_values<pstore::index::hamt_map<std::__cxx11::string,pstore::extent<char>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>>,__gnu_cxx::__normal_iterator<pstore::address*,std::vector<pstore::address,std::allocator<pstore::address>>>>
                  ((vector<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>_>_>
                    *)&local_238,(_anonymous_namespace_ *)pdVar1,
                   (database *)local_258._M_dataplus._M_p,
                   (hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_258._M_string_length,_Var4,in_R9);
        testing::UnorderedElementsAre<std::pair<std::__cxx11::string,pstore::extent<char>>>
                  (&local_c0,(testing *)&local_120,matchers);
        local_1f8 = (undefined1  [8])&local_1e8;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_1f8,
                   local_c0.matchers_.
                   super__Tuple_impl<0UL,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>_>
                   .
                   super__Head_base<0UL,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>,_false>
                   ._M_head_impl.first._M_dataplus._M_p,
                   local_c0.matchers_.
                   super__Tuple_impl<0UL,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>_>
                   .
                   super__Head_base<0UL,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>,_false>
                   ._M_head_impl.first._M_dataplus._M_p +
                   local_c0.matchers_.
                   super__Tuple_impl<0UL,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>_>
                   .
                   super__Head_base<0UL,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>,_false>
                   ._M_head_impl.first._M_string_length);
        local_1d8 = (undefined4)
                    local_c0.matchers_.
                    super__Tuple_impl<0UL,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>_>
                    .
                    super__Head_base<0UL,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>,_false>
                    ._M_head_impl.second.addr.a_.a_;
        uStack_1d4 = local_c0.matchers_.
                     super__Tuple_impl<0UL,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>_>
                     .
                     super__Head_base<0UL,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>,_false>
                     ._M_head_impl.second.addr.a_.a_._4_4_;
        uStack_1d0 = (undefined4)
                     local_c0.matchers_.
                     super__Tuple_impl<0UL,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>_>
                     .
                     super__Head_base<0UL,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>,_false>
                     ._M_head_impl.second.size;
        uStack_1cc = local_c0.matchers_.
                     super__Tuple_impl<0UL,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>_>
                     .
                     super__Head_base<0UL,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>,_false>
                     ._M_head_impl.second.size._4_4_;
        local_190 = (undefined1  [8])&local_180;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_190,local_1f8,
                   (char *)((long)local_1f8 + (long)&pdStack_1f0->_vptr_database));
        local_170.addr.a_.a_._4_4_ = uStack_1d4;
        local_170.addr.a_.a_._0_4_ = local_1d8;
        local_170.size._4_4_ = uStack_1cc;
        local_170.size._0_4_ = uStack_1d0;
        if (local_1f8 != (undefined1  [8])&local_1e8) {
          operator_delete((void *)local_1f8,local_1e8._M_allocated_capacity + 1);
        }
        testing::internal::
        PredicateFormatterFromMatcher<testing::internal::UnorderedElementsAreMatcher<std::tuple<std::pair<std::__cxx11::string,pstore::extent<char>>>>>
        ::operator()(local_218,local_190,
                     (vector<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>_>_>
                      *)"actual_values");
        if (local_190 != (undefined1  [8])&local_180) {
          operator_delete((void *)local_190,local_180._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c0.matchers_.
               super__Tuple_impl<0UL,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>_>
               .
               super__Head_base<0UL,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>,_false>
               ._M_head_impl.first._M_dataplus._M_p !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)((long)&local_c0.matchers_.
                       super__Tuple_impl<0UL,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>_>
                       .
                       super__Head_base<0UL,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>,_false>
                       ._M_head_impl.first + 0x10U)) {
          operator_delete(local_c0.matchers_.
                          super__Tuple_impl<0UL,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>_>
                          .
                          super__Head_base<0UL,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>,_false>
                          ._M_head_impl.first._M_dataplus._M_p,
                          local_c0.matchers_.
                          super__Tuple_impl<0UL,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>_>
                          .
                          super__Head_base<0UL,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>,_false>
                          ._M_head_impl.first.field_2._M_allocated_capacity + 1);
        }
        if (local_218[0] == '\0') {
          testing::Message::Message((Message *)local_1f8);
          if (local_210 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar5 = "";
          }
          else {
            pcVar5 = (local_210->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)local_190,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_diff.cpp"
                     ,0x84,pcVar5);
          testing::internal::AssertHelper::operator=((AssertHelper *)local_190,(Message *)local_1f8)
          ;
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_190);
          if (local_1f8 != (undefined1  [8])0x0) {
            (**(code **)(*(size_type *)local_1f8 + 8))();
          }
        }
        if (local_210 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_210,local_210);
        }
        std::
        vector<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>_>_>
        ::~vector((vector<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>_>_>
                   *)&local_238);
        if ((database *)local_258._M_dataplus._M_p != (database *)0x0) {
          operator_delete(local_258._M_dataplus._M_p,
                          local_258.field_2._M_allocated_capacity - (long)local_258._M_dataplus._M_p
                         );
        }
        if (local_208.
            super___shared_ptr<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_208.
                     super___shared_ptr<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi);
        }
        local_1f8 = (undefined1  [8])0x0;
        pdStack_1f0 = (database *)0x0;
        local_1e8._M_allocated_capacity = 0;
        pstore::index::
        get_index<(pstore::trailer::indices)5,pstore::database,pstore::index::hamt_map<std::__cxx11::string,pstore::extent<char>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>>>
                  ((index *)local_190,pdVar1,true);
        pstore::
        diff<pstore::index::hamt_map<std::__cxx11::string,pstore::extent<char>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>>,std::back_insert_iterator<std::vector<pstore::address,std::allocator<pstore::address>>>>
                  (pdVar1,(hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_190,2,
                   (vector<pstore::address,_std::allocator<pstore::address>_> *)local_1f8);
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT71(local_188._1_7_,local_188[0])
            != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     CONCAT71(local_188._1_7_,local_188[0]));
        }
        local_258._M_dataplus._M_p = (pointer)((long)pdStack_1f0 - (long)local_1f8 >> 3);
        local_238._M_dataplus._M_p = local_238._M_dataplus._M_p & 0xffffffff00000000;
        testing::internal::CmpHelperEQ<unsigned_long,unsigned_int>
                  ((internal *)local_190,"actual.size ()","0U",(unsigned_long *)&local_258,
                   (uint *)&local_238);
        if (local_190[0] == (string)0x0) {
          testing::Message::Message((Message *)&local_258);
          if ((undefined8 *)CONCAT71(local_188._1_7_,local_188[0]) == (undefined8 *)0x0) {
            pcVar5 = "";
          }
          else {
            pcVar5 = *(char **)CONCAT71(local_188._1_7_,local_188[0]);
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&local_238,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_diff.cpp"
                     ,0x8c,pcVar5);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&local_238,(Message *)&local_258);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_238);
          if ((database *)local_258._M_dataplus._M_p != (database *)0x0) {
            (**(code **)(*(long *)local_258._M_dataplus._M_p + 8))();
          }
        }
        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            CONCAT71(local_188._1_7_,local_188[0]) !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()(local_188,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT71(local_188._1_7_,local_188[0]));
        }
        if (local_1f8 != (undefined1  [8])0x0) {
          operator_delete((void *)local_1f8,local_1e8._M_allocated_capacity - (long)local_1f8);
        }
        goto LAB_0015b83a;
      }
      testing::Message::Message((Message *)local_190);
      if (pdStack_1f0 == (database *)0x0) {
        pcVar5 = "";
      }
      else {
        pcVar5 = ((_Alloc_hider *)&pdStack_1f0->_vptr_database)->_M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_258,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_diff.cpp"
                 ,0x7e,pcVar5);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_258,(Message *)local_190);
    }
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_258);
    if (local_190 != (undefined1  [8])0x0) {
      (**(code **)(*(size_type *)local_190 + 8))();
    }
    if (pdStack_1f0 != (database *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&pdStack_1f0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pdStack_1f0)
      ;
    }
    if (local_208.
        super___shared_ptr<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_208.
                 super___shared_ptr<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
  }
LAB_0015b83a:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120.first._M_dataplus._M_p != &local_120.first.field_2) {
    operator_delete(local_120.first._M_dataplus._M_p,
                    CONCAT71(local_120.first.field_2._M_allocated_capacity._1_7_,
                             local_120.first.field_2._M_local_buf[0]) + 1);
  }
  if (local_f0 != &local_e0) {
    operator_delete(local_f0,CONCAT71(uStack_df,local_e0) + 1);
  }
  return;
}

Assistant:

TEST_F (Diff, BuildWriteIndexValues) {
    using ::testing::ContainerEq;
    using ::testing::WhenSortedBy;

    using value_type = std::pair<std::string, pstore::extent<char>>;
    value_type v1, v2;

    {
        std::string const k1 = "key1";
        transaction_type t1 = begin (db_, lock_guard{mutex_});
        v1 = std::make_pair (k1, this->add (t1, k1, "first value"));
        t1.commit ();
    }
    {
        std::string const k2 = "key2";
        transaction_type t2 = begin (db_, lock_guard{mutex_});
        v2 = std::make_pair (k2, this->add (t2, k2, "second value"));
        t2.commit ();
    }
    ASSERT_EQ (2U, db_.get_current_revision ());

    {
        // Check the diff between r2 and r0.
        auto index = pstore::index::get_index<pstore::trailer::indices::write> (db_);
        ASSERT_NE (index, nullptr);

        std::vector<pstore::address> actual;
        pstore::diff (db_, *index, 0U, std::back_inserter (actual));
        auto const actual_values =
            addresses_to_values (db_, *index, std::begin (actual), std::end (actual));
        EXPECT_THAT (actual_values, ::testing::UnorderedElementsAre (v1, v2));
    }

    {
        // Check the diff between r2 and r1.
        auto index = pstore::index::get_index<pstore::trailer::indices::write> (db_);
        ASSERT_NE (index, nullptr);

        std::vector<pstore::address> actual;
        pstore::diff (db_, *index, 1U, std::back_inserter (actual));
        auto const actual_values =
            addresses_to_values (db_, *index, std::begin (actual), std::end (actual));
        EXPECT_THAT (actual_values, ::testing::UnorderedElementsAre (v2));
    }

    {
        // Check the diff between r2 and r2.
        std::vector<pstore::address> actual;
        pstore::diff (db_, *pstore::index::get_index<pstore::trailer::indices::write> (db_), 2U,
                      std::back_inserter (actual));
        EXPECT_EQ (actual.size (), 0U);
    }
}